

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_timer_fast.c
# Opt level: O2

int s_task_sleep_ticks(s_awaiter_t *__awaiter_dummy__,my_clock_t ticks)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  my_clock_t mVar4;
  long *in_FS_OFFSET;
  s_timer_t timer;
  
  mVar4 = my_clock();
  lVar1 = *in_FS_OFFSET;
  timer.task = (s_task_t *)in_FS_OFFSET[-0x1d];
  timer.wakeup_ticks = mVar4 + ticks;
  _Var2 = rbt_insert((RBTree *)(lVar1 + -0xe0),&timer.rbt_node);
  if (_Var2) {
    s_list_detach(&(timer.task)->node);
    s_task_next(__awaiter_dummy__);
    if (timer.task != (s_task_t *)0x0) {
      timer.task = (s_task_t *)0x0;
      rbt_delete((RBTree *)(lVar1 + -0xe0),&timer.rbt_node);
    }
    iVar3 = -(uint)*(byte *)(in_FS_OFFSET[-0x1d] + 0x50);
    *(undefined1 *)(in_FS_OFFSET[-0x1d] + 0x50) = 0;
  }
  else {
    fwrite("timer insert failed!\n",0x15,1,_stderr);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int s_task_sleep_ticks(__async__, my_clock_t ticks) {
    my_clock_t current_ticks;
    s_timer_t timer;
    
    current_ticks = my_clock();
    
    timer.task = g_globals.current_task;
    timer.wakeup_ticks = current_ticks + ticks;

    dump_timers(__LINE__);

    if (!rbt_insert(&g_globals.timers, &timer.rbt_node)) {
#ifndef NDEBUG
        fprintf(stderr, "timer insert failed!\n");
#endif
        return -1;
    }

    dump_timers(__LINE__);

    s_list_detach(&timer.task->node);   /* no need, for safe */
    s_task_next(__await__);

    dump_timers(__LINE__);

    if (timer.task != NULL) {
        timer.task = NULL;
        rbt_delete(&g_globals.timers, &timer.rbt_node);
    }

    int ret = (g_globals.current_task->waiting_cancelled ? -1 : 0);
    g_globals.current_task->waiting_cancelled = false;
    return ret;
}